

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void run_negation_range_inplace_test5(void)

{
  _Bool unaff_retaddr;
  
  run_negation_range_tests(1000,999,1,0,2,1,false,unaff_retaddr);
  return;
}

Assistant:

DEFINE_TEST(run_negation_range_inplace_test5) {
    // runs of length 999 begin every 10000 starting
    // at 1.
    // last run starts at 65001 hence we end in a
    // run.
    // negation over whole range.  Result should be
    // bitset

    run_negation_range_tests(1000, 999, 1, 0x0000, 0x10000,
                             ARRAY_CONTAINER_TYPE, true,
                             false);  // request but don't get inplace
}